

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O3

void __thiscall duel::duel(duel *this,card *cards)

{
  field *enemyField;
  field *field__;
  hand *enemyHand;
  hand *hand__;
  uint uVar1;
  ostream *poVar2;
  duel *this_00;
  
  this->totalCards = 0x2c;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<card,_std::allocator<card>_>::_M_initialize_map
            ((_Deque_base<card,_std::allocator<card>_> *)&this->deck,0);
  (this->field1).pile = 0;
  (this->field1).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field1).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->field1).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->field1).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->field2).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field2).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field2).field_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hand1).regularCards = 0;
  (this->hand1).specialCards = 0;
  (this->hand1).hand_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hand1).hand_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hand1).hand_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->hand2).regularCards = 0;
  (this->hand2).specialCards = 0;
  (this->hand2).hand_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hand2).hand_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hand2).hand_.super__Vector_base<card,_std::allocator<card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->player = 1;
  this->duelEnd = false;
  while ((this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         (this->deck).c.super__Deque_base<card,_std::allocator<card>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    std::deque<card,_std::allocator<card>_>::pop_back(&(this->deck).c);
  }
  createDeck(this,cards);
  initializeHands(this);
  initializeField_(this);
  this->player = 2 - ((this->field1).pile < (this->field2).pile);
  if (this->duelEnd == false) {
    enemyField = &this->field1;
    field__ = &this->field2;
    enemyHand = &this->hand1;
    hand__ = &this->hand2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"player ",7);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'s turn.",8);
      system("pause");
      this_00 = this;
      printField(this);
      if (this->player == 1) {
        if (enemyHand->regularCards == 0) {
LAB_00102fc3:
          this->duelEnd = true;
        }
        else {
          uVar1 = pickCard(this_00,enemyHand,false);
          playCard(this,enemyHand,hand__,enemyField,field__,uVar1);
          if (enemyField->pile < field__->pile) {
            this->duelEnd = true;
          }
          this->player = 2;
        }
      }
      else {
        if (hand__->regularCards == 0) goto LAB_00102fc3;
        uVar1 = pickCard(this_00,hand__,false);
        playCard(this,hand__,enemyHand,field__,enemyField,uVar1);
        if (field__->pile < enemyField->pile) {
          this->duelEnd = true;
        }
        this->player = 1;
      }
      if (enemyField->pile == field__->pile) {
        enemyField->pile = 0;
        field__->pile = 0;
        field::clearField(enemyField);
        field::clearField(field__);
        initializeField_(this);
        this->player = 2 - ((this->field1).pile < (this->field2).pile);
      }
    } while (this->duelEnd != true);
  }
  checkEnd(this);
  return;
}

Assistant:

duel::duel(card cards[]) {
    player = 1;
    duelEnd = false;
    while(!deck.empty()) deck.pop();
    createDeck(cards);
    initializeHands();
    // sets up field by drawing until tie is gone
    initializeField();
    // player 1 goes first if pile is less than player 2, else player 2's turn
    player = (field1.getPile() < field2.getPile()) ? 1 : 2;
    while(!duelEnd) {
        cout << "player " << player << "'s turn.";
        system("pause");
        printField();
        if(player == 1) {
            // check if hand only has special cards
            if(hand1.getRegularCards() == 0) duelEnd = true;
            else {
                playCard(hand1,hand2,field1,field2,pickCard(hand1,false));
                // check if lost
                if (field2.getPile() > field1.getPile()) duelEnd = true;
                player = 2;
            }
        }
        else {
            // check if hand only has special cards
            if(hand2.getRegularCards() == 0) duelEnd = true;
            else {
                playCard(hand2,hand1,field2,field1,pickCard(hand2,false));
                // check if lost
                if (field1.getPile() > field2.getPile()) duelEnd = true;
                player = 1;
            }
        }
        if (equalValue()) {
            resetField();
            initializeField();
            player = (field1.getPile() < field2.getPile()) ? 1 : 2;
        }
    }
    checkEnd();
}